

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O1

void PrintName(InstructionVMGraphContext *ctx,VmValue *value,bool fullName,bool noExtraInfo)

{
  VmValueType VVar1;
  TypeBase *pTVar2;
  VmValue *value_00;
  VmValue *value_01;
  _func_int **pp_Var3;
  VmValue *pVVar4;
  _func_int **pp_Var5;
  uint uVar6;
  ulong uVar7;
  VmConstant *constant;
  char *pcVar8;
  
  if ((value == (VmValue *)0x0) || (constant = (VmConstant *)value, value->typeID != 1)) {
    constant = (VmConstant *)0x0;
  }
  if (constant == (VmConstant *)0x0) {
    if ((value == (VmValue *)0x0) || (pVVar4 = value, value->typeID != 2)) {
      pVVar4 = (VmValue *)0x0;
    }
    if (pVVar4 == (VmValue *)0x0) {
      if ((value == (VmValue *)0x0) || (pVVar4 = value, value->typeID != 3)) {
        pVVar4 = (VmValue *)0x0;
      }
      if (pVVar4 == (VmValue *)0x0) {
        if ((value == (VmValue *)0x0) || (pVVar4 = value, value->typeID != 4)) {
          pVVar4 = (VmValue *)0x0;
        }
        if (pVVar4 == (VmValue *)0x0) {
          if (value != (VmValue *)0x0) {
            __assert_fail("!\"unknown type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmGraph.cpp"
                          ,0x8e,"void PrintName(InstructionVMGraphContext &, VmValue *, bool, bool)"
                         );
          }
          Print(ctx,"%%null%%");
          return;
        }
        pp_Var3 = pVVar4[1]._vptr_VmValue;
        if (pp_Var3 == (_func_int **)0x0) {
          Print(ctx,"global");
          goto LAB_0029e854;
        }
        pp_Var5 = *(_func_int ***)(pp_Var3[7] + 0x40);
        uVar6 = *(int *)(pp_Var3[7] + 0x48) - (int)pp_Var5;
        VVar1 = *(VmValueType *)(pp_Var3 + 0xb);
        pcVar8 = "%.*s.f%04x";
      }
      else {
        pp_Var5 = pVVar4[1]._vptr_VmValue;
        uVar6 = pVVar4[1].typeID - (int)pp_Var5;
        VVar1 = pVVar4[1].type.type;
        pcVar8 = "%.*s.b%d";
      }
      Print(ctx,pcVar8,(ulong)uVar6,pp_Var5,(ulong)VVar1);
    }
    else {
      if ((fullName) && (value_00 = (VmValue *)pVVar4[1].users.data, value_00 != (VmValue *)0x0)) {
        value_01 = (VmValue *)value_00[1].type.structType;
        if (value_01 != (VmValue *)0x0) {
          PrintName(ctx,value_01,true,true);
          Print(ctx,".");
        }
        PrintName(ctx,value_00,true,true);
        Print(ctx,".");
      }
      Print(ctx,"%%%d",(ulong)*(uint *)((long)&pVVar4[1]._vptr_VmValue + 4));
      if (*(int *)(pVVar4[1].users.little + 7) != 0) {
        Print(ctx,".c%d");
      }
      if ((*(int *)(pVVar4[1].users.little + 3) != 0) &&
         (Print(ctx,".r"), *(int *)(pVVar4[1].users.little + 3) != 0)) {
        uVar7 = 0;
        do {
          pcVar8 = "|%d";
          if (uVar7 == 0) {
            pcVar8 = "%d";
          }
          Print(ctx,pcVar8,
                (ulong)*(byte *)((long)(pVVar4[1].users.little[2]->users).little + (uVar7 - 0x50)));
          uVar7 = uVar7 + 1;
        } while (uVar7 < *(uint *)(pVVar4[1].users.little + 3));
      }
    }
  }
  else {
    PrintConstant(ctx,constant);
  }
LAB_0029e854:
  if (!noExtraInfo) {
    if (ctx->showFullTypes == true) {
      pTVar2 = (value->type).structType;
      if (pTVar2 == (TypeBase *)0x0) {
        Print(ctx," <");
        PrintType(ctx,value->type);
        Print(ctx,">");
      }
      else {
        Print(ctx," <%.*s>",(ulong)(uint)(*(int *)&(pTVar2->name).end - (int)(pTVar2->name).begin));
      }
    }
    if ((ctx->showComments == true) &&
       (pcVar8 = (value->comment).begin, pcVar8 != (value->comment).end)) {
      Print(ctx," (%.*s)",(ulong)(uint)(*(int *)&(value->comment).end - (int)pcVar8));
      return;
    }
  }
  return;
}

Assistant:

void PrintName(InstructionVMGraphContext &ctx, VmValue *value, bool fullName, bool noExtraInfo)
{
	if(VmConstant *constant = getType<VmConstant>(value))
	{
		PrintConstant(ctx, constant);
	}
	else if(VmInstruction *inst = getType<VmInstruction>(value))
	{
		if(fullName)
		{
			if(VmBlock *block = inst->parent)
			{
				if(VmFunction *function = block->parent)
				{
					PrintName(ctx, function, true, true);
					Print(ctx, ".");
				}

				PrintName(ctx, block, true, true);
				Print(ctx, ".");
			}
		}

		Print(ctx, "%%%d", inst->uniqueId);

		if(inst->color)
			Print(ctx, ".c%d", inst->color);

		if(!inst->regVmRegisters.empty())
		{
			Print(ctx, ".r");

			for(unsigned i = 0; i < inst->regVmRegisters.size(); i++)
				Print(ctx, i == 0 ? "%d" : "|%d", inst->regVmRegisters[i]);
		}
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		Print(ctx, "%.*s.b%d", FMT_ISTR(block->name), block->uniqueId);
	}
	else if(VmFunction *function = getType<VmFunction>(value))
	{
		if(FunctionData *fData = function->function)
			Print(ctx, "%.*s.f%04x", FMT_ISTR(fData->name->name), fData->uniqueId);
		else
			Print(ctx, "global");
	}
	else if(!value)
	{
		Print(ctx, "%%null%%");

		noExtraInfo = true;
	}
	else
	{
		assert(!"unknown type");
	}

	if(noExtraInfo)
		return;

	if(ctx.showFullTypes)
	{
		if(value->type.structType)
		{
			Print(ctx, " <%.*s>", FMT_ISTR(value->type.structType->name));
		}
		else
		{
			Print(ctx, " <");
			PrintType(ctx, value->type);
			Print(ctx, ">");
		}
	}

	if(ctx.showComments && !value->comment.empty())
		Print(ctx, " (%.*s)", FMT_ISTR(value->comment));
}